

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unix.h
# Opt level: O3

bool MakeErrMsg(string *ErrMsg,string *prefix,int errnum)

{
  undefined1 in_AL;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 uVar1;
  uint *puVar2;
  undefined8 *puVar3;
  long *extraout_RAX;
  long *plVar4;
  uint in_ECX;
  int errnum_00;
  undefined4 in_register_00000014;
  ulong uVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  string local_70;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  if (ErrMsg == (string *)0x0) {
    return (bool)in_AL;
  }
  if (in_ECX == 0xffffffff) {
    puVar2 = (uint *)__errno_location();
    in_ECX = *puVar2;
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,prefix,
             (long)&(prefix->_M_dataplus)._M_p + CONCAT44(in_register_00000014,errnum));
  std::__cxx11::string::append((char *)&local_50);
  llvm::sys::StrError_abi_cxx11_(&local_70,(sys *)(ulong)in_ECX,errnum_00);
  uVar5 = 0xf;
  if (local_50 != local_40) {
    uVar5 = local_40[0];
  }
  if (uVar5 < local_70._M_string_length + local_48) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar6 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_48 <= (ulong)uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      goto LAB_0019a09e;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
LAB_0019a09e:
  local_90 = &local_80;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_80 = *plVar4;
    uStack_78 = puVar3[3];
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*puVar3;
  }
  local_88 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  std::__cxx11::string::operator=((string *)ErrMsg,(string *)&local_90);
  plVar4 = &local_80;
  if (local_90 != plVar4) {
    operator_delete(local_90,local_80 + 1);
    plVar4 = extraout_RAX;
  }
  uVar1 = SUB81(plVar4,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    uVar1 = extraout_AL;
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
    uVar1 = extraout_AL_00;
  }
  return (bool)uVar1;
}

Assistant:

static inline bool MakeErrMsg(
  std::string* ErrMsg, const std::string& prefix, int errnum = -1) {
  if (!ErrMsg)
    return true;
  if (errnum == -1)
    errnum = errno;
  *ErrMsg = prefix + ": " + llvm::sys::StrError(errnum);
  return true;
}